

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void moveToParent(BtCursor *pCur)

{
  MemPage *pPage;
  char cVar1;
  MemPage *pLeaf;
  BtCursor *pCur_local;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  pCur->ix = pCur->aiIdx[pCur->iPage + -1];
  pPage = pCur->pPage;
  cVar1 = pCur->iPage + -1;
  pCur->iPage = cVar1;
  pCur->pPage = pCur->apPage[cVar1];
  releasePageNotNull(pPage);
  return;
}

Assistant:

static void moveToParent(BtCursor *pCur){
  MemPage *pLeaf;
  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->iPage>0 );
  assert( pCur->pPage );
  assertParentIndex(
    pCur->apPage[pCur->iPage-1],
    pCur->aiIdx[pCur->iPage-1],
    pCur->pPage->pgno
  );
  testcase( pCur->aiIdx[pCur->iPage-1] > pCur->apPage[pCur->iPage-1]->nCell );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  pCur->ix = pCur->aiIdx[pCur->iPage-1];
  pLeaf = pCur->pPage;
  pCur->pPage = pCur->apPage[--pCur->iPage];
  releasePageNotNull(pLeaf);
}